

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  ulong uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 (*pauVar63) [16];
  int iVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  Scene *pSVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  undefined1 (*pauVar74) [16];
  ulong uVar75;
  ulong uVar76;
  undefined4 uVar77;
  ulong unaff_R13;
  float fVar78;
  float fVar84;
  float fVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar89 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar94;
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 extraout_var [56];
  float fVar109;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar110;
  float fVar114;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar120 [32];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar129;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar132;
  float fVar133;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar144;
  undefined1 auVar145 [32];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar146 [64];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar173;
  undefined1 auVar174 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [64];
  float fVar182;
  float fVar183;
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar185 [64];
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 *local_1580;
  ulong local_1578;
  ulong local_1570;
  ulong local_1568;
  undefined1 local_1560 [32];
  undefined8 local_1540;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined4 local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  RTCHitN local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  uint local_1320;
  uint uStack_131c;
  uint uStack_1318;
  uint uStack_1314;
  uint uStack_1310;
  uint uStack_130c;
  uint uStack_1308;
  uint uStack_1304;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar74 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar77 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13d0._4_4_ = uVar77;
  local_13d0._0_4_ = uVar77;
  local_13d0._8_4_ = uVar77;
  local_13d0._12_4_ = uVar77;
  auVar142 = ZEXT1664(local_13d0);
  uVar77 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13e0._4_4_ = uVar77;
  local_13e0._0_4_ = uVar77;
  local_13e0._8_4_ = uVar77;
  local_13e0._12_4_ = uVar77;
  auVar146 = ZEXT1664(local_13e0);
  uVar77 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13f0._4_4_ = uVar77;
  local_13f0._0_4_ = uVar77;
  local_13f0._8_4_ = uVar77;
  local_13f0._12_4_ = uVar77;
  auVar164 = ZEXT1664(local_13f0);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar79 = ZEXT416((uint)(fVar86 * 0.99999964));
  local_1400 = vshufps_avx(auVar79,auVar79,0);
  auVar172 = ZEXT1664(local_1400);
  auVar79 = ZEXT416((uint)(fVar2 * 0.99999964));
  local_1410 = vshufps_avx(auVar79,auVar79,0);
  auVar175 = ZEXT1664(local_1410);
  auVar79 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1420 = vshufps_avx(auVar79,auVar79,0);
  auVar185 = ZEXT1664(local_1420);
  auVar79 = ZEXT416((uint)(fVar86 * 1.0000004));
  local_1430 = vshufps_avx(auVar79,auVar79,0);
  auVar200 = ZEXT1664(local_1430);
  auVar79 = ZEXT416((uint)(fVar2 * 1.0000004));
  local_1440 = vshufps_avx(auVar79,auVar79,0);
  auVar208 = ZEXT1664(local_1440);
  auVar79 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_1450 = vshufps_avx(auVar79,auVar79,0);
  auVar210 = ZEXT1664(local_1450);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1568 = uVar69 ^ 0x10;
  local_1570 = uVar70 ^ 0x10;
  local_1578 = uVar73 ^ 0x10;
  iVar64 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar64;
  local_14b0._0_4_ = iVar64;
  local_14b0._8_4_ = iVar64;
  local_14b0._12_4_ = iVar64;
  auVar140 = ZEXT1664(local_14b0);
  local_1120._16_16_ = mm_lookupmask_ps._240_16_;
  local_1120._0_16_ = mm_lookupmask_ps._0_16_;
  iVar64 = (tray->tfar).field_0.i[k];
  auVar83 = ZEXT1664(CONCAT412(iVar64,CONCAT48(iVar64,CONCAT44(iVar64,iVar64))));
  local_1580 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = &DAT_3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar90._8_4_ = 0xbf800000;
  auVar90._0_8_ = 0xbf800000bf800000;
  auVar90._12_4_ = 0xbf800000;
  auVar90._16_4_ = 0xbf800000;
  auVar90._20_4_ = 0xbf800000;
  auVar90._24_4_ = 0xbf800000;
  auVar90._28_4_ = 0xbf800000;
  local_1140 = vblendvps_avx(auVar120,auVar90,local_1120);
  do {
    do {
      do {
        if (pauVar74 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar63 = pauVar74 + -1;
        pauVar74 = pauVar74 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar63 + 8));
      uVar76 = *(ulong *)*pauVar74;
      do {
        if ((uVar76 & 8) == 0) {
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + uVar69),auVar142._0_16_);
          auVar87._0_4_ = auVar172._0_4_ * auVar79._0_4_;
          auVar87._4_4_ = auVar172._4_4_ * auVar79._4_4_;
          auVar87._8_4_ = auVar172._8_4_ * auVar79._8_4_;
          auVar87._12_4_ = auVar172._12_4_ * auVar79._12_4_;
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + uVar70),auVar146._0_16_);
          auVar100._0_4_ = auVar175._0_4_ * auVar79._0_4_;
          auVar100._4_4_ = auVar175._4_4_ * auVar79._4_4_;
          auVar100._8_4_ = auVar175._8_4_ * auVar79._8_4_;
          auVar100._12_4_ = auVar175._12_4_ * auVar79._12_4_;
          auVar79 = vmaxps_avx(auVar87,auVar100);
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + uVar73),auVar164._0_16_);
          auVar101._0_4_ = auVar185._0_4_ * auVar87._0_4_;
          auVar101._4_4_ = auVar185._4_4_ * auVar87._4_4_;
          auVar101._8_4_ = auVar185._8_4_ * auVar87._8_4_;
          auVar101._12_4_ = auVar185._12_4_ * auVar87._12_4_;
          auVar87 = vmaxps_avx(auVar101,auVar140._0_16_);
          auVar87 = vmaxps_avx(auVar79,auVar87);
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + local_1568),auVar142._0_16_);
          auVar102._0_4_ = auVar200._0_4_ * auVar79._0_4_;
          auVar102._4_4_ = auVar200._4_4_ * auVar79._4_4_;
          auVar102._8_4_ = auVar200._8_4_ * auVar79._8_4_;
          auVar102._12_4_ = auVar200._12_4_ * auVar79._12_4_;
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + local_1570),auVar146._0_16_);
          auVar116._0_4_ = auVar208._0_4_ * auVar79._0_4_;
          auVar116._4_4_ = auVar208._4_4_ * auVar79._4_4_;
          auVar116._8_4_ = auVar208._8_4_ * auVar79._8_4_;
          auVar116._12_4_ = auVar208._12_4_ * auVar79._12_4_;
          auVar79 = vminps_avx(auVar102,auVar116);
          auVar100 = vsubps_avx(*(undefined1 (*) [16])(uVar76 + 0x20 + local_1578),auVar164._0_16_);
          auVar117._0_4_ = auVar210._0_4_ * auVar100._0_4_;
          auVar117._4_4_ = auVar210._4_4_ * auVar100._4_4_;
          auVar117._8_4_ = auVar210._8_4_ * auVar100._8_4_;
          auVar117._12_4_ = auVar210._12_4_ * auVar100._12_4_;
          auVar100 = vminps_avx(auVar117,auVar83._0_16_);
          auVar79 = vminps_avx(auVar79,auVar100);
          auVar79 = vcmpps_avx(auVar87,auVar79,2);
          uVar77 = vmovmskps_avx(auVar79);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar77);
          local_1300._0_16_ = auVar87;
        }
        if ((uVar76 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar64 = 4;
          }
          else {
            uVar75 = uVar76 & 0xfffffffffffffff0;
            lVar72 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
              }
            }
            iVar64 = 0;
            uVar76 = *(ulong *)(uVar75 + lVar72 * 8);
            uVar71 = unaff_R13 - 1 & unaff_R13;
            if (uVar71 != 0) {
              uVar66 = *(uint *)(local_1300 + lVar72 * 4);
              lVar72 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                }
              }
              uVar5 = *(ulong *)(uVar75 + lVar72 * 8);
              uVar65 = *(uint *)(local_1300 + lVar72 * 4);
              uVar71 = uVar71 - 1 & uVar71;
              if (uVar71 == 0) {
                if (uVar66 < uVar65) {
                  *(ulong *)*pauVar74 = uVar5;
                  *(uint *)(*pauVar74 + 8) = uVar65;
                  pauVar74 = pauVar74 + 1;
                }
                else {
                  *(ulong *)*pauVar74 = uVar76;
                  *(uint *)(*pauVar74 + 8) = uVar66;
                  pauVar74 = pauVar74 + 1;
                  uVar76 = uVar5;
                }
              }
              else {
                auVar79._8_8_ = 0;
                auVar79._0_8_ = uVar76;
                auVar79 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar66));
                auVar103._8_8_ = 0;
                auVar103._0_8_ = uVar5;
                auVar87 = vpunpcklqdq_avx(auVar103,ZEXT416(uVar65));
                lVar72 = 0;
                if (uVar71 != 0) {
                  for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                  }
                }
                auVar118._8_8_ = 0;
                auVar118._0_8_ = *(ulong *)(uVar75 + lVar72 * 8);
                auVar101 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_1300 + lVar72 * 4)));
                auVar100 = vpcmpgtd_avx(auVar87,auVar79);
                uVar71 = uVar71 - 1 & uVar71;
                if (uVar71 == 0) {
                  auVar102 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar87,auVar79,auVar102);
                  auVar79 = vblendvps_avx(auVar79,auVar87,auVar102);
                  auVar87 = vpcmpgtd_avx(auVar101,auVar100);
                  auVar102 = vpshufd_avx(auVar87,0xaa);
                  auVar87 = vblendvps_avx(auVar101,auVar100,auVar102);
                  auVar100 = vblendvps_avx(auVar100,auVar101,auVar102);
                  auVar101 = vpcmpgtd_avx(auVar100,auVar79);
                  auVar102 = vpshufd_avx(auVar101,0xaa);
                  auVar101 = vblendvps_avx(auVar100,auVar79,auVar102);
                  auVar79 = vblendvps_avx(auVar79,auVar100,auVar102);
                  *pauVar74 = auVar79;
                  pauVar74[1] = auVar101;
                  uVar76 = auVar87._0_8_;
                  pauVar74 = pauVar74 + 2;
                }
                else {
                  lVar72 = 0;
                  if (uVar71 != 0) {
                    for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                    }
                  }
                  auVar134._8_8_ = 0;
                  auVar134._0_8_ = *(ulong *)(uVar75 + lVar72 * 8);
                  auVar116 = vpunpcklqdq_avx(auVar134,ZEXT416(*(uint *)(local_1300 + lVar72 * 4)));
                  auVar102 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar87,auVar79,auVar102);
                  auVar79 = vblendvps_avx(auVar79,auVar87,auVar102);
                  auVar87 = vpcmpgtd_avx(auVar116,auVar101);
                  auVar102 = vpshufd_avx(auVar87,0xaa);
                  auVar87 = vblendvps_avx(auVar116,auVar101,auVar102);
                  auVar101 = vblendvps_avx(auVar101,auVar116,auVar102);
                  auVar102 = vpcmpgtd_avx(auVar101,auVar79);
                  auVar116 = vpshufd_avx(auVar102,0xaa);
                  auVar102 = vblendvps_avx(auVar101,auVar79,auVar116);
                  auVar79 = vblendvps_avx(auVar79,auVar101,auVar116);
                  auVar101 = vpcmpgtd_avx(auVar87,auVar100);
                  auVar116 = vpshufd_avx(auVar101,0xaa);
                  auVar101 = vblendvps_avx(auVar87,auVar100,auVar116);
                  auVar87 = vblendvps_avx(auVar100,auVar87,auVar116);
                  auVar100 = vpcmpgtd_avx(auVar102,auVar87);
                  auVar116 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar102,auVar87,auVar116);
                  auVar87 = vblendvps_avx(auVar87,auVar102,auVar116);
                  *pauVar74 = auVar79;
                  pauVar74[1] = auVar87;
                  pauVar74[2] = auVar100;
                  auVar140 = ZEXT1664(local_14b0);
                  uVar76 = auVar101._0_8_;
                  pauVar74 = pauVar74 + 3;
                }
              }
            }
          }
        }
        else {
          iVar64 = 6;
        }
      } while (iVar64 == 0);
    } while (iVar64 != 6);
    uVar75 = (ulong)((uint)uVar76 & 0xf);
    if (uVar75 != 8) {
      uVar76 = uVar76 & 0xfffffffffffffff0;
      lVar72 = 0;
      do {
        lVar67 = lVar72 * 0xe0;
        lVar1 = uVar76 + 0xd0 + lVar67;
        local_13c0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_13b8 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar76 + 0xc0 + lVar67;
        local_fc0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_fb0 = local_fc0;
        uStack_fa8 = uStack_fb8;
        uStack_13b0 = local_13c0;
        uStack_13a8 = uStack_13b8;
        auVar80._16_16_ = *(undefined1 (*) [16])(uVar76 + 0x60 + lVar67);
        auVar80._0_16_ = *(undefined1 (*) [16])(uVar76 + lVar67);
        auVar91._16_16_ = *(undefined1 (*) [16])(uVar76 + 0x70 + lVar67);
        auVar91._0_16_ = *(undefined1 (*) [16])(uVar76 + 0x10 + lVar67);
        auVar104._16_16_ = *(undefined1 (*) [16])(uVar76 + 0x80 + lVar67);
        auVar104._0_16_ = *(undefined1 (*) [16])(uVar76 + 0x20 + lVar67);
        auVar79 = *(undefined1 (*) [16])(uVar76 + 0x30 + lVar67);
        auVar135._16_16_ = auVar79;
        auVar135._0_16_ = auVar79;
        auVar79 = *(undefined1 (*) [16])(uVar76 + 0x40 + lVar67);
        auVar138._16_16_ = auVar79;
        auVar138._0_16_ = auVar79;
        auVar79 = *(undefined1 (*) [16])(uVar76 + 0x50 + lVar67);
        auVar141._16_16_ = auVar79;
        auVar141._0_16_ = auVar79;
        auVar79 = *(undefined1 (*) [16])(uVar76 + 0x90 + lVar67);
        auVar145._16_16_ = auVar79;
        auVar145._0_16_ = auVar79;
        auVar79 = *(undefined1 (*) [16])(uVar76 + 0xa0 + lVar67);
        auVar161._16_16_ = auVar79;
        auVar161._0_16_ = auVar79;
        auVar87 = *(undefined1 (*) [16])(uVar76 + 0xb0 + lVar67);
        auVar171._16_16_ = auVar87;
        auVar171._0_16_ = auVar87;
        uVar77 = *(undefined4 *)(ray + k * 4);
        auVar174._4_4_ = uVar77;
        auVar174._0_4_ = uVar77;
        auVar174._8_4_ = uVar77;
        auVar174._12_4_ = uVar77;
        auVar174._16_4_ = uVar77;
        auVar174._20_4_ = uVar77;
        auVar174._24_4_ = uVar77;
        auVar174._28_4_ = uVar77;
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar184._4_4_ = uVar77;
        auVar184._0_4_ = uVar77;
        auVar184._8_4_ = uVar77;
        auVar184._12_4_ = uVar77;
        auVar184._16_4_ = uVar77;
        auVar184._20_4_ = uVar77;
        auVar184._24_4_ = uVar77;
        auVar184._28_4_ = uVar77;
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar207._4_4_ = uVar77;
        auVar207._0_4_ = uVar77;
        auVar207._8_4_ = uVar77;
        auVar207._12_4_ = uVar77;
        auVar207._16_4_ = uVar77;
        auVar207._20_4_ = uVar77;
        auVar207._24_4_ = uVar77;
        auVar207._28_4_ = uVar77;
        local_14a0 = vsubps_avx(auVar80,auVar174);
        local_fe0 = vsubps_avx(auVar91,auVar184);
        local_1000 = vsubps_avx(auVar104,auVar207);
        auVar90 = vsubps_avx(auVar135,auVar174);
        auVar120 = vsubps_avx(auVar138,auVar184);
        auVar26 = vsubps_avx(auVar141,auVar207);
        auVar27 = vsubps_avx(auVar145,auVar174);
        auVar28 = vsubps_avx(auVar161,auVar184);
        auVar29 = vsubps_avx(auVar171,auVar207);
        local_1020 = vsubps_avx(auVar27,local_14a0);
        local_1040 = vsubps_avx(auVar28,local_fe0);
        local_1060 = vsubps_avx(auVar29,local_1000);
        fVar2 = local_fe0._0_4_;
        fVar86 = auVar28._0_4_ + fVar2;
        fVar9 = local_fe0._4_4_;
        fVar94 = auVar28._4_4_ + fVar9;
        fVar109 = local_fe0._8_4_;
        fVar95 = auVar28._8_4_ + fVar109;
        fVar112 = local_fe0._12_4_;
        fVar96 = auVar28._12_4_ + fVar112;
        fVar13 = local_fe0._16_4_;
        fVar97 = auVar28._16_4_ + fVar13;
        fVar16 = local_fe0._20_4_;
        fVar98 = auVar28._20_4_ + fVar16;
        fVar19 = local_fe0._24_4_;
        fVar99 = auVar28._24_4_ + fVar19;
        fVar3 = local_1000._0_4_;
        fVar143 = auVar29._0_4_ + fVar3;
        fVar10 = local_1000._4_4_;
        fVar147 = auVar29._4_4_ + fVar10;
        fVar110 = local_1000._8_4_;
        fVar149 = auVar29._8_4_ + fVar110;
        fVar114 = local_1000._12_4_;
        fVar151 = auVar29._12_4_ + fVar114;
        fVar14 = local_1000._16_4_;
        fVar153 = auVar29._16_4_ + fVar14;
        fVar17 = local_1000._20_4_;
        fVar155 = auVar29._20_4_ + fVar17;
        fVar20 = local_1000._24_4_;
        fVar157 = auVar29._24_4_ + fVar20;
        fVar160 = local_1000._28_4_;
        fVar22 = local_1060._0_4_;
        fVar23 = local_1060._4_4_;
        auVar30._4_4_ = fVar94 * fVar23;
        auVar30._0_4_ = fVar86 * fVar22;
        fVar24 = local_1060._8_4_;
        auVar30._8_4_ = fVar95 * fVar24;
        fVar25 = local_1060._12_4_;
        auVar30._12_4_ = fVar96 * fVar25;
        fVar78 = local_1060._16_4_;
        auVar30._16_4_ = fVar97 * fVar78;
        fVar84 = local_1060._20_4_;
        auVar30._20_4_ = fVar98 * fVar84;
        fVar85 = local_1060._24_4_;
        auVar30._24_4_ = fVar99 * fVar85;
        auVar30._28_4_ = auVar79._12_4_;
        fVar182 = local_1040._0_4_;
        fVar186 = local_1040._4_4_;
        auVar31._4_4_ = fVar186 * fVar147;
        auVar31._0_4_ = fVar182 * fVar143;
        fVar188 = local_1040._8_4_;
        auVar31._8_4_ = fVar188 * fVar149;
        fVar190 = local_1040._12_4_;
        auVar31._12_4_ = fVar190 * fVar151;
        fVar192 = local_1040._16_4_;
        auVar31._16_4_ = fVar192 * fVar153;
        fVar194 = local_1040._20_4_;
        auVar31._20_4_ = fVar194 * fVar155;
        fVar196 = local_1040._24_4_;
        auVar31._24_4_ = fVar196 * fVar157;
        auVar31._28_4_ = auVar87._12_4_;
        auVar30 = vsubps_avx(auVar31,auVar30);
        fVar8 = local_14a0._0_4_;
        fVar159 = auVar27._0_4_ + fVar8;
        fVar11 = local_14a0._4_4_;
        fVar165 = auVar27._4_4_ + fVar11;
        fVar111 = local_14a0._8_4_;
        fVar166 = auVar27._8_4_ + fVar111;
        fVar12 = local_14a0._12_4_;
        fVar167 = auVar27._12_4_ + fVar12;
        fVar15 = local_14a0._16_4_;
        fVar168 = auVar27._16_4_ + fVar15;
        fVar18 = local_14a0._20_4_;
        fVar169 = auVar27._20_4_ + fVar18;
        fVar21 = local_14a0._24_4_;
        fVar170 = auVar27._24_4_ + fVar21;
        fVar173 = local_1020._0_4_;
        fVar176 = local_1020._4_4_;
        auVar32._4_4_ = fVar176 * fVar147;
        auVar32._0_4_ = fVar173 * fVar143;
        fVar177 = local_1020._8_4_;
        auVar32._8_4_ = fVar177 * fVar149;
        fVar178 = local_1020._12_4_;
        auVar32._12_4_ = fVar178 * fVar151;
        fVar179 = local_1020._16_4_;
        auVar32._16_4_ = fVar179 * fVar153;
        fVar180 = local_1020._20_4_;
        auVar32._20_4_ = fVar180 * fVar155;
        fVar181 = local_1020._24_4_;
        auVar32._24_4_ = fVar181 * fVar157;
        auVar32._28_4_ = auVar29._28_4_ + fVar160;
        auVar80 = local_1060;
        auVar33._4_4_ = fVar165 * fVar23;
        auVar33._0_4_ = fVar159 * fVar22;
        auVar33._8_4_ = fVar166 * fVar24;
        auVar33._12_4_ = fVar167 * fVar25;
        auVar33._16_4_ = fVar168 * fVar78;
        auVar33._20_4_ = fVar169 * fVar84;
        auVar33._24_4_ = fVar170 * fVar85;
        auVar33._28_4_ = auVar87._12_4_;
        auVar31 = vsubps_avx(auVar33,auVar32);
        auVar33 = local_1040;
        auVar34._4_4_ = fVar165 * fVar186;
        auVar34._0_4_ = fVar159 * fVar182;
        auVar34._8_4_ = fVar166 * fVar188;
        auVar34._12_4_ = fVar167 * fVar190;
        auVar34._16_4_ = fVar168 * fVar192;
        auVar34._20_4_ = fVar169 * fVar194;
        auVar34._24_4_ = fVar170 * fVar196;
        auVar34._28_4_ = auVar27._28_4_ + local_14a0._28_4_;
        auVar35._4_4_ = fVar176 * fVar94;
        auVar35._0_4_ = fVar173 * fVar86;
        auVar35._8_4_ = fVar177 * fVar95;
        auVar35._12_4_ = fVar178 * fVar96;
        auVar35._16_4_ = fVar179 * fVar97;
        auVar35._20_4_ = fVar180 * fVar98;
        auVar35._24_4_ = fVar181 * fVar99;
        auVar35._28_4_ = auVar28._28_4_ + local_fe0._28_4_;
        auVar32 = vsubps_avx(auVar35,auVar34);
        local_1540._4_4_ = *(float *)(ray + k * 4 + 0x50);
        fVar86 = *(float *)(ray + k * 4 + 0x60);
        fStack_147c = *(float *)(ray + k * 4 + 0x40);
        local_10a0._0_4_ =
             auVar30._0_4_ * fStack_147c + local_1540._4_4_ * auVar31._0_4_ + auVar32._0_4_ * fVar86
        ;
        local_10a0._4_4_ =
             auVar30._4_4_ * fStack_147c + local_1540._4_4_ * auVar31._4_4_ + auVar32._4_4_ * fVar86
        ;
        local_10a0._8_4_ =
             auVar30._8_4_ * fStack_147c + local_1540._4_4_ * auVar31._8_4_ + auVar32._8_4_ * fVar86
        ;
        local_10a0._12_4_ =
             auVar30._12_4_ * fStack_147c +
             local_1540._4_4_ * auVar31._12_4_ + auVar32._12_4_ * fVar86;
        local_10a0._16_4_ =
             auVar30._16_4_ * fStack_147c +
             local_1540._4_4_ * auVar31._16_4_ + auVar32._16_4_ * fVar86;
        local_10a0._20_4_ =
             auVar30._20_4_ * fStack_147c +
             local_1540._4_4_ * auVar31._20_4_ + auVar32._20_4_ * fVar86;
        local_10a0._24_4_ =
             auVar30._24_4_ * fStack_147c +
             local_1540._4_4_ * auVar31._24_4_ + auVar32._24_4_ * fVar86;
        local_10a0._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar32._28_4_;
        local_1080 = vsubps_avx(local_fe0,auVar120);
        auVar31 = vsubps_avx(local_1000,auVar26);
        fVar96 = fVar2 + auVar120._0_4_;
        fVar97 = fVar9 + auVar120._4_4_;
        fVar98 = fVar109 + auVar120._8_4_;
        fVar99 = fVar112 + auVar120._12_4_;
        fVar143 = fVar13 + auVar120._16_4_;
        fVar147 = fVar16 + auVar120._20_4_;
        fVar149 = fVar19 + auVar120._24_4_;
        fVar94 = auVar120._28_4_;
        fVar151 = fVar3 + auVar26._0_4_;
        fVar153 = fVar10 + auVar26._4_4_;
        fVar155 = fVar110 + auVar26._8_4_;
        fVar157 = fVar114 + auVar26._12_4_;
        fVar159 = fVar14 + auVar26._16_4_;
        fVar165 = fVar17 + auVar26._20_4_;
        fVar166 = fVar20 + auVar26._24_4_;
        fVar95 = auVar26._28_4_;
        fVar199 = auVar31._0_4_;
        fVar201 = auVar31._4_4_;
        auVar36._4_4_ = fVar201 * fVar97;
        auVar36._0_4_ = fVar199 * fVar96;
        fVar202 = auVar31._8_4_;
        auVar36._8_4_ = fVar202 * fVar98;
        fVar203 = auVar31._12_4_;
        auVar36._12_4_ = fVar203 * fVar99;
        fVar204 = auVar31._16_4_;
        auVar36._16_4_ = fVar204 * fVar143;
        fVar205 = auVar31._20_4_;
        auVar36._20_4_ = fVar205 * fVar147;
        fVar206 = auVar31._24_4_;
        auVar36._24_4_ = fVar206 * fVar149;
        auVar36._28_4_ = auVar30._28_4_;
        fVar144 = local_1080._0_4_;
        fVar148 = local_1080._4_4_;
        auVar37._4_4_ = fVar148 * fVar153;
        auVar37._0_4_ = fVar144 * fVar151;
        fVar150 = local_1080._8_4_;
        auVar37._8_4_ = fVar150 * fVar155;
        fVar152 = local_1080._12_4_;
        auVar37._12_4_ = fVar152 * fVar157;
        fVar154 = local_1080._16_4_;
        auVar37._16_4_ = fVar154 * fVar159;
        fVar156 = local_1080._20_4_;
        auVar37._20_4_ = fVar156 * fVar165;
        fVar158 = local_1080._24_4_;
        auVar37._24_4_ = fVar158 * fVar166;
        auVar37._28_4_ = fVar160;
        auVar30 = vsubps_avx(auVar37,auVar36);
        auVar31 = vsubps_avx(local_14a0,auVar90);
        fVar209 = auVar31._0_4_;
        fVar211 = auVar31._4_4_;
        auVar38._4_4_ = fVar211 * fVar153;
        auVar38._0_4_ = fVar209 * fVar151;
        fVar212 = auVar31._8_4_;
        auVar38._8_4_ = fVar212 * fVar155;
        fVar213 = auVar31._12_4_;
        auVar38._12_4_ = fVar213 * fVar157;
        fVar214 = auVar31._16_4_;
        auVar38._16_4_ = fVar214 * fVar159;
        fVar215 = auVar31._20_4_;
        auVar38._20_4_ = fVar215 * fVar165;
        fVar216 = auVar31._24_4_;
        auVar38._24_4_ = fVar216 * fVar166;
        auVar38._28_4_ = fVar160 + fVar95;
        fVar160 = auVar90._0_4_ + fVar8;
        fVar151 = auVar90._4_4_ + fVar11;
        fVar153 = auVar90._8_4_ + fVar111;
        fVar155 = auVar90._12_4_ + fVar12;
        fVar157 = auVar90._16_4_ + fVar15;
        fVar159 = auVar90._20_4_ + fVar18;
        fVar165 = auVar90._24_4_ + fVar21;
        fVar198 = auVar90._28_4_;
        auVar39._4_4_ = fVar151 * fVar201;
        auVar39._0_4_ = fVar160 * fVar199;
        auVar39._8_4_ = fVar153 * fVar202;
        auVar39._12_4_ = fVar155 * fVar203;
        auVar39._16_4_ = fVar157 * fVar204;
        auVar39._20_4_ = fVar159 * fVar205;
        auVar39._24_4_ = fVar165 * fVar206;
        auVar39._28_4_ = fVar198;
        auVar31 = vsubps_avx(auVar39,auVar38);
        auVar40._4_4_ = fVar151 * fVar148;
        auVar40._0_4_ = fVar160 * fVar144;
        auVar40._8_4_ = fVar153 * fVar150;
        auVar40._12_4_ = fVar155 * fVar152;
        auVar40._16_4_ = fVar157 * fVar154;
        auVar40._20_4_ = fVar159 * fVar156;
        auVar40._24_4_ = fVar165 * fVar158;
        auVar40._28_4_ = fVar198 + local_14a0._28_4_;
        auVar41._4_4_ = fVar211 * fVar97;
        auVar41._0_4_ = fVar209 * fVar96;
        auVar41._8_4_ = fVar212 * fVar98;
        auVar41._12_4_ = fVar213 * fVar99;
        auVar41._16_4_ = fVar214 * fVar143;
        auVar41._20_4_ = fVar215 * fVar147;
        auVar41._24_4_ = fVar216 * fVar149;
        auVar41._28_4_ = local_fe0._28_4_ + fVar94;
        auVar32 = vsubps_avx(auVar41,auVar40);
        local_10c0._0_4_ =
             fStack_147c * auVar30._0_4_ + auVar32._0_4_ * fVar86 + local_1540._4_4_ * auVar31._0_4_
        ;
        local_10c0._4_4_ =
             fStack_147c * auVar30._4_4_ + auVar32._4_4_ * fVar86 + local_1540._4_4_ * auVar31._4_4_
        ;
        local_10c0._8_4_ =
             fStack_147c * auVar30._8_4_ + auVar32._8_4_ * fVar86 + local_1540._4_4_ * auVar31._8_4_
        ;
        local_10c0._12_4_ =
             fStack_147c * auVar30._12_4_ +
             auVar32._12_4_ * fVar86 + local_1540._4_4_ * auVar31._12_4_;
        local_10c0._16_4_ =
             fStack_147c * auVar30._16_4_ +
             auVar32._16_4_ * fVar86 + local_1540._4_4_ * auVar31._16_4_;
        local_10c0._20_4_ =
             fStack_147c * auVar30._20_4_ +
             auVar32._20_4_ * fVar86 + local_1540._4_4_ * auVar31._20_4_;
        local_10c0._24_4_ =
             fStack_147c * auVar30._24_4_ +
             auVar32._24_4_ * fVar86 + local_1540._4_4_ * auVar31._24_4_;
        local_10c0._28_4_ = auVar31._28_4_ + auVar32._28_4_ + auVar31._28_4_;
        auVar30 = vsubps_avx(auVar90,auVar27);
        fVar165 = auVar90._0_4_ + auVar27._0_4_;
        fVar166 = auVar90._4_4_ + auVar27._4_4_;
        fVar167 = auVar90._8_4_ + auVar27._8_4_;
        fVar168 = auVar90._12_4_ + auVar27._12_4_;
        fVar169 = auVar90._16_4_ + auVar27._16_4_;
        fVar170 = auVar90._20_4_ + auVar27._20_4_;
        fVar113 = auVar90._24_4_ + auVar27._24_4_;
        auVar31 = vsubps_avx(auVar120,auVar28);
        fVar115 = auVar120._0_4_ + auVar28._0_4_;
        fVar123 = auVar120._4_4_ + auVar28._4_4_;
        fVar124 = auVar120._8_4_ + auVar28._8_4_;
        fVar125 = auVar120._12_4_ + auVar28._12_4_;
        fVar126 = auVar120._16_4_ + auVar28._16_4_;
        fVar127 = auVar120._20_4_ + auVar28._20_4_;
        fVar128 = auVar120._24_4_ + auVar28._24_4_;
        fVar129 = fVar94 + auVar28._28_4_;
        auVar90 = vsubps_avx(auVar26,auVar29);
        fVar151 = auVar29._0_4_ + auVar26._0_4_;
        fVar153 = auVar29._4_4_ + auVar26._4_4_;
        fVar155 = auVar29._8_4_ + auVar26._8_4_;
        fVar157 = auVar29._12_4_ + auVar26._12_4_;
        fVar159 = auVar29._16_4_ + auVar26._16_4_;
        fVar132 = auVar29._20_4_ + auVar26._20_4_;
        fVar133 = auVar29._24_4_ + auVar26._24_4_;
        fVar183 = auVar90._0_4_;
        fVar187 = auVar90._4_4_;
        auVar26._4_4_ = fVar187 * fVar123;
        auVar26._0_4_ = fVar183 * fVar115;
        fVar189 = auVar90._8_4_;
        auVar26._8_4_ = fVar189 * fVar124;
        fVar191 = auVar90._12_4_;
        auVar26._12_4_ = fVar191 * fVar125;
        fVar193 = auVar90._16_4_;
        auVar26._16_4_ = fVar193 * fVar126;
        fVar195 = auVar90._20_4_;
        auVar26._20_4_ = fVar195 * fVar127;
        fVar197 = auVar90._24_4_;
        auVar26._24_4_ = fVar197 * fVar128;
        auVar26._28_4_ = fVar94;
        fVar160 = auVar31._0_4_;
        fVar94 = auVar31._4_4_;
        auVar28._4_4_ = fVar94 * fVar153;
        auVar28._0_4_ = fVar160 * fVar151;
        fVar96 = auVar31._8_4_;
        auVar28._8_4_ = fVar96 * fVar155;
        fVar97 = auVar31._12_4_;
        auVar28._12_4_ = fVar97 * fVar157;
        fVar98 = auVar31._16_4_;
        auVar28._16_4_ = fVar98 * fVar159;
        fVar99 = auVar31._20_4_;
        auVar28._20_4_ = fVar99 * fVar132;
        fVar143 = auVar31._24_4_;
        auVar28._24_4_ = fVar143 * fVar133;
        auVar28._28_4_ = fVar95;
        auVar90 = vsubps_avx(auVar28,auVar26);
        fVar147 = auVar30._0_4_;
        fVar149 = auVar30._4_4_;
        auVar42._4_4_ = fVar149 * fVar153;
        auVar42._0_4_ = fVar147 * fVar151;
        fVar151 = auVar30._8_4_;
        auVar42._8_4_ = fVar151 * fVar155;
        fVar153 = auVar30._12_4_;
        auVar42._12_4_ = fVar153 * fVar157;
        fVar155 = auVar30._16_4_;
        auVar42._16_4_ = fVar155 * fVar159;
        fVar157 = auVar30._20_4_;
        auVar42._20_4_ = fVar157 * fVar132;
        fVar159 = auVar30._24_4_;
        auVar42._24_4_ = fVar159 * fVar133;
        auVar42._28_4_ = auVar29._28_4_ + fVar95;
        auVar29._4_4_ = fVar187 * fVar166;
        auVar29._0_4_ = fVar183 * fVar165;
        auVar29._8_4_ = fVar189 * fVar167;
        auVar29._12_4_ = fVar191 * fVar168;
        auVar29._16_4_ = fVar193 * fVar169;
        auVar29._20_4_ = fVar195 * fVar170;
        auVar29._24_4_ = fVar197 * fVar113;
        auVar29._28_4_ = fVar95;
        auVar120 = vsubps_avx(auVar29,auVar42);
        auVar43._4_4_ = fVar166 * fVar94;
        auVar43._0_4_ = fVar165 * fVar160;
        auVar43._8_4_ = fVar167 * fVar96;
        auVar43._12_4_ = fVar168 * fVar97;
        auVar43._16_4_ = fVar169 * fVar98;
        auVar43._20_4_ = fVar170 * fVar99;
        auVar43._24_4_ = fVar113 * fVar143;
        auVar43._28_4_ = fVar198 + auVar27._28_4_;
        auVar27._4_4_ = fVar149 * fVar123;
        auVar27._0_4_ = fVar147 * fVar115;
        auVar27._8_4_ = fVar151 * fVar124;
        auVar27._12_4_ = fVar153 * fVar125;
        auVar27._16_4_ = fVar155 * fVar126;
        auVar27._20_4_ = fVar157 * fVar127;
        auVar27._24_4_ = fVar159 * fVar128;
        auVar27._28_4_ = fVar129;
        auVar26 = vsubps_avx(auVar27,auVar43);
        local_1540._0_4_ = local_1540._4_4_;
        fStack_1538 = local_1540._4_4_;
        fStack_1534 = local_1540._4_4_;
        fStack_1530 = local_1540._4_4_;
        fStack_152c = local_1540._4_4_;
        fStack_1528 = local_1540._4_4_;
        fStack_1524 = local_1540._4_4_;
        auVar105._0_4_ =
             fStack_147c * auVar90._0_4_ +
             auVar26._0_4_ * fVar86 + local_1540._4_4_ * auVar120._0_4_;
        auVar105._4_4_ =
             fStack_147c * auVar90._4_4_ +
             auVar26._4_4_ * fVar86 + local_1540._4_4_ * auVar120._4_4_;
        auVar105._8_4_ =
             fStack_147c * auVar90._8_4_ +
             auVar26._8_4_ * fVar86 + local_1540._4_4_ * auVar120._8_4_;
        auVar105._12_4_ =
             fStack_147c * auVar90._12_4_ +
             auVar26._12_4_ * fVar86 + local_1540._4_4_ * auVar120._12_4_;
        auVar105._16_4_ =
             fStack_147c * auVar90._16_4_ +
             auVar26._16_4_ * fVar86 + local_1540._4_4_ * auVar120._16_4_;
        auVar105._20_4_ =
             fStack_147c * auVar90._20_4_ +
             auVar26._20_4_ * fVar86 + local_1540._4_4_ * auVar120._20_4_;
        auVar105._24_4_ =
             fStack_147c * auVar90._24_4_ +
             auVar26._24_4_ * fVar86 + local_1540._4_4_ * auVar120._24_4_;
        auVar105._28_4_ = fVar129 + auVar26._28_4_ + fVar129;
        local_10e0._0_4_ = auVar105._0_4_ + local_10a0._0_4_ + local_10c0._0_4_;
        local_10e0._4_4_ = auVar105._4_4_ + local_10a0._4_4_ + local_10c0._4_4_;
        local_10e0._8_4_ = auVar105._8_4_ + local_10a0._8_4_ + local_10c0._8_4_;
        local_10e0._12_4_ = auVar105._12_4_ + local_10a0._12_4_ + local_10c0._12_4_;
        local_10e0._16_4_ = auVar105._16_4_ + local_10a0._16_4_ + local_10c0._16_4_;
        local_10e0._20_4_ = auVar105._20_4_ + local_10a0._20_4_ + local_10c0._20_4_;
        local_10e0._24_4_ = auVar105._24_4_ + local_10a0._24_4_ + local_10c0._24_4_;
        local_10e0._28_4_ = auVar105._28_4_ + local_10a0._28_4_ + local_10c0._28_4_;
        auVar90 = vminps_avx(local_10a0,local_10c0);
        auVar90 = vminps_avx(auVar90,auVar105);
        auVar130._8_4_ = 0x7fffffff;
        auVar130._0_8_ = 0x7fffffff7fffffff;
        auVar130._12_4_ = 0x7fffffff;
        auVar130._16_4_ = 0x7fffffff;
        auVar130._20_4_ = 0x7fffffff;
        auVar130._24_4_ = 0x7fffffff;
        auVar130._28_4_ = 0x7fffffff;
        local_1100 = vandps_avx(local_10e0,auVar130);
        fVar165 = local_1100._0_4_ * 1.1920929e-07;
        fVar166 = local_1100._4_4_ * 1.1920929e-07;
        auVar44._4_4_ = fVar166;
        auVar44._0_4_ = fVar165;
        fVar167 = local_1100._8_4_ * 1.1920929e-07;
        auVar44._8_4_ = fVar167;
        fVar168 = local_1100._12_4_ * 1.1920929e-07;
        auVar44._12_4_ = fVar168;
        fVar169 = local_1100._16_4_ * 1.1920929e-07;
        auVar44._16_4_ = fVar169;
        fVar170 = local_1100._20_4_ * 1.1920929e-07;
        auVar44._20_4_ = fVar170;
        fVar113 = local_1100._24_4_ * 1.1920929e-07;
        auVar44._24_4_ = fVar113;
        auVar44._28_4_ = 0x34000000;
        auVar139._0_8_ = CONCAT44(fVar166,fVar165) ^ 0x8000000080000000;
        auVar139._8_4_ = -fVar167;
        auVar139._12_4_ = -fVar168;
        auVar139._16_4_ = -fVar169;
        auVar139._20_4_ = -fVar170;
        auVar139._24_4_ = -fVar113;
        auVar139._28_4_ = 0xb4000000;
        auVar90 = vcmpps_avx(auVar90,auVar139,5);
        auVar26 = vmaxps_avx(local_10a0,local_10c0);
        auVar120 = vmaxps_avx(auVar26,auVar105);
        auVar120 = vcmpps_avx(auVar120,auVar44,2);
        auVar120 = vorps_avx(auVar90,auVar120);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          auVar45._4_4_ = fVar148 * fVar23;
          auVar45._0_4_ = fVar144 * fVar22;
          auVar45._8_4_ = fVar150 * fVar24;
          auVar45._12_4_ = fVar152 * fVar25;
          auVar45._16_4_ = fVar154 * fVar78;
          auVar45._20_4_ = fVar156 * fVar84;
          auVar45._24_4_ = fVar158 * fVar85;
          auVar45._28_4_ = auVar90._28_4_;
          auVar46._4_4_ = fVar186 * fVar201;
          auVar46._0_4_ = fVar182 * fVar199;
          auVar46._8_4_ = fVar188 * fVar202;
          auVar46._12_4_ = fVar190 * fVar203;
          auVar46._16_4_ = fVar192 * fVar204;
          auVar46._20_4_ = fVar194 * fVar205;
          auVar46._24_4_ = fVar196 * fVar206;
          auVar46._28_4_ = 0x34000000;
          auVar27 = vsubps_avx(auVar46,auVar45);
          auVar47._4_4_ = fVar201 * fVar94;
          auVar47._0_4_ = fVar199 * fVar160;
          auVar47._8_4_ = fVar202 * fVar96;
          auVar47._12_4_ = fVar203 * fVar97;
          auVar47._16_4_ = fVar204 * fVar98;
          auVar47._20_4_ = fVar205 * fVar99;
          auVar47._24_4_ = fVar206 * fVar143;
          auVar47._28_4_ = auVar26._28_4_;
          auVar48._4_4_ = fVar148 * fVar187;
          auVar48._0_4_ = fVar144 * fVar183;
          auVar48._8_4_ = fVar150 * fVar189;
          auVar48._12_4_ = fVar152 * fVar191;
          auVar48._16_4_ = fVar154 * fVar193;
          auVar48._20_4_ = fVar156 * fVar195;
          auVar48._24_4_ = fVar158 * fVar197;
          auVar48._28_4_ = fVar95;
          auVar28 = vsubps_avx(auVar48,auVar47);
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar162._16_4_ = 0x7fffffff;
          auVar162._20_4_ = 0x7fffffff;
          auVar162._24_4_ = 0x7fffffff;
          auVar162._28_4_ = 0x7fffffff;
          auVar90 = vandps_avx(auVar162,auVar45);
          auVar26 = vandps_avx(auVar162,auVar47);
          auVar90 = vcmpps_avx(auVar90,auVar26,1);
          local_12a0 = vblendvps_avx(auVar28,auVar27,auVar90);
          auVar49._4_4_ = fVar211 * fVar187;
          auVar49._0_4_ = fVar209 * fVar183;
          auVar49._8_4_ = fVar212 * fVar189;
          auVar49._12_4_ = fVar213 * fVar191;
          auVar49._16_4_ = fVar214 * fVar193;
          auVar49._20_4_ = fVar215 * fVar195;
          auVar49._24_4_ = fVar216 * fVar197;
          auVar49._28_4_ = auVar90._28_4_;
          auVar50._4_4_ = fVar211 * fVar23;
          auVar50._0_4_ = fVar209 * fVar22;
          auVar50._8_4_ = fVar212 * fVar24;
          auVar50._12_4_ = fVar213 * fVar25;
          auVar50._16_4_ = fVar214 * fVar78;
          auVar50._20_4_ = fVar215 * fVar84;
          auVar50._24_4_ = fVar216 * fVar85;
          auVar50._28_4_ = auVar27._28_4_;
          auVar51._4_4_ = fVar201 * fVar176;
          auVar51._0_4_ = fVar199 * fVar173;
          auVar51._8_4_ = fVar202 * fVar177;
          auVar51._12_4_ = fVar203 * fVar178;
          auVar51._16_4_ = fVar204 * fVar179;
          auVar51._20_4_ = fVar205 * fVar180;
          auVar51._24_4_ = fVar206 * fVar181;
          auVar51._28_4_ = local_1060._28_4_;
          auVar27 = vsubps_avx(auVar50,auVar51);
          auVar52._4_4_ = fVar201 * fVar149;
          auVar52._0_4_ = fVar199 * fVar147;
          auVar52._8_4_ = fVar202 * fVar151;
          auVar52._12_4_ = fVar203 * fVar153;
          auVar52._16_4_ = fVar204 * fVar155;
          auVar52._20_4_ = fVar205 * fVar157;
          auVar52._24_4_ = fVar206 * fVar159;
          auVar52._28_4_ = auVar26._28_4_;
          auVar28 = vsubps_avx(auVar52,auVar49);
          auVar90 = vandps_avx(auVar162,auVar51);
          auVar26 = vandps_avx(auVar162,auVar49);
          auVar90 = vcmpps_avx(auVar90,auVar26,1);
          local_1280 = vblendvps_avx(auVar28,auVar27,auVar90);
          auVar53._4_4_ = fVar148 * fVar149;
          auVar53._0_4_ = fVar144 * fVar147;
          auVar53._8_4_ = fVar150 * fVar151;
          auVar53._12_4_ = fVar152 * fVar153;
          auVar53._16_4_ = fVar154 * fVar155;
          auVar53._20_4_ = fVar156 * fVar157;
          auVar53._24_4_ = fVar158 * fVar159;
          auVar53._28_4_ = auVar30._28_4_;
          auVar54._4_4_ = fVar148 * fVar176;
          auVar54._0_4_ = fVar144 * fVar173;
          auVar54._8_4_ = fVar150 * fVar177;
          auVar54._12_4_ = fVar152 * fVar178;
          auVar54._16_4_ = fVar154 * fVar179;
          auVar54._20_4_ = fVar156 * fVar180;
          auVar54._24_4_ = fVar158 * fVar181;
          auVar54._28_4_ = auVar90._28_4_;
          auVar55._4_4_ = fVar211 * fVar186;
          auVar55._0_4_ = fVar209 * fVar182;
          auVar55._8_4_ = fVar212 * fVar188;
          auVar55._12_4_ = fVar213 * fVar190;
          auVar55._16_4_ = fVar214 * fVar192;
          auVar55._20_4_ = fVar215 * fVar194;
          auVar55._24_4_ = fVar216 * fVar196;
          auVar55._28_4_ = auVar27._28_4_;
          auVar56._4_4_ = fVar211 * fVar94;
          auVar56._0_4_ = fVar209 * fVar160;
          auVar56._8_4_ = fVar212 * fVar96;
          auVar56._12_4_ = fVar213 * fVar97;
          auVar56._16_4_ = fVar214 * fVar98;
          auVar56._20_4_ = fVar215 * fVar99;
          auVar56._24_4_ = fVar216 * fVar143;
          auVar56._28_4_ = auVar31._28_4_;
          auVar27 = vsubps_avx(auVar54,auVar55);
          auVar28 = vsubps_avx(auVar56,auVar53);
          auVar90 = vandps_avx(auVar162,auVar55);
          auVar26 = vandps_avx(auVar162,auVar53);
          auVar26 = vcmpps_avx(auVar90,auVar26,1);
          local_1260 = vblendvps_avx(auVar28,auVar27,auVar26);
          auVar79 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          fVar143 = local_1260._0_4_;
          fVar147 = local_1260._4_4_;
          fVar149 = local_1260._8_4_;
          fVar151 = local_1260._12_4_;
          fVar153 = local_1260._16_4_;
          fVar155 = local_1260._20_4_;
          fVar157 = local_1260._24_4_;
          fVar159 = local_1280._0_4_;
          fVar165 = local_1280._4_4_;
          fVar166 = local_1280._8_4_;
          fVar167 = local_1280._12_4_;
          fVar168 = local_1280._16_4_;
          fVar169 = local_1280._20_4_;
          fVar170 = local_1280._24_4_;
          fVar160 = local_12a0._0_4_;
          fVar94 = local_12a0._4_4_;
          fVar95 = local_12a0._8_4_;
          fVar22 = local_12a0._12_4_;
          fVar23 = local_12a0._16_4_;
          fVar24 = local_12a0._20_4_;
          fVar25 = local_12a0._24_4_;
          fVar78 = fStack_147c * fVar160 + fVar143 * fVar86 + fVar159 * local_1540._4_4_;
          fVar84 = fStack_147c * fVar94 + fVar147 * fVar86 + fVar165 * local_1540._4_4_;
          fVar85 = fStack_147c * fVar95 + fVar149 * fVar86 + fVar166 * local_1540._4_4_;
          fVar96 = fStack_147c * fVar22 + fVar151 * fVar86 + fVar167 * local_1540._4_4_;
          fVar97 = fStack_147c * fVar23 + fVar153 * fVar86 + fVar168 * local_1540._4_4_;
          fVar98 = fStack_147c * fVar24 + fVar155 * fVar86 + fVar169 * local_1540._4_4_;
          fVar86 = fStack_147c * fVar25 + fVar157 * fVar86 + fVar170 * local_1540._4_4_;
          fVar99 = auVar120._28_4_ + auVar120._28_4_ + 0.0;
          auVar81._0_4_ = fVar78 + fVar78;
          auVar81._4_4_ = fVar84 + fVar84;
          auVar81._8_4_ = fVar85 + fVar85;
          auVar81._12_4_ = fVar96 + fVar96;
          auVar81._16_4_ = fVar97 + fVar97;
          auVar81._20_4_ = fVar98 + fVar98;
          auVar81._24_4_ = fVar86 + fVar86;
          auVar81._28_4_ = fVar99 + fVar99;
          fVar78 = fVar160 * fVar8 + fVar143 * fVar3 + fVar159 * fVar2;
          fVar84 = fVar94 * fVar11 + fVar147 * fVar10 + fVar165 * fVar9;
          fVar109 = fVar95 * fVar111 + fVar149 * fVar110 + fVar166 * fVar109;
          fVar110 = fVar22 * fVar12 + fVar151 * fVar114 + fVar167 * fVar112;
          fVar111 = fVar23 * fVar15 + fVar153 * fVar14 + fVar168 * fVar13;
          fVar112 = fVar24 * fVar18 + fVar155 * fVar17 + fVar169 * fVar16;
          fVar114 = fVar25 * fVar21 + fVar157 * fVar20 + fVar170 * fVar19;
          auVar120 = vrcpps_avx(auVar81);
          fVar86 = auVar120._0_4_;
          fVar2 = auVar120._4_4_;
          auVar57._4_4_ = auVar81._4_4_ * fVar2;
          auVar57._0_4_ = auVar81._0_4_ * fVar86;
          fVar3 = auVar120._8_4_;
          auVar57._8_4_ = auVar81._8_4_ * fVar3;
          fVar8 = auVar120._12_4_;
          auVar57._12_4_ = auVar81._12_4_ * fVar8;
          fVar9 = auVar120._16_4_;
          auVar57._16_4_ = auVar81._16_4_ * fVar9;
          fVar10 = auVar120._20_4_;
          auVar57._20_4_ = auVar81._20_4_ * fVar10;
          fVar11 = auVar120._24_4_;
          auVar57._24_4_ = auVar81._24_4_ * fVar11;
          auVar57._28_4_ = auVar90._28_4_;
          auVar136._8_4_ = 0x3f800000;
          auVar136._0_8_ = &DAT_3f8000003f800000;
          auVar136._12_4_ = 0x3f800000;
          auVar136._16_4_ = 0x3f800000;
          auVar136._20_4_ = 0x3f800000;
          auVar136._24_4_ = 0x3f800000;
          auVar136._28_4_ = 0x3f800000;
          auVar90 = vsubps_avx(auVar136,auVar57);
          local_11e0._4_4_ = (fVar84 + fVar84) * (fVar2 + fVar2 * auVar90._4_4_);
          local_11e0._0_4_ = (fVar78 + fVar78) * (fVar86 + fVar86 * auVar90._0_4_);
          local_11e0._8_4_ = (fVar109 + fVar109) * (fVar3 + fVar3 * auVar90._8_4_);
          local_11e0._12_4_ = (fVar110 + fVar110) * (fVar8 + fVar8 * auVar90._12_4_);
          local_11e0._16_4_ = (fVar111 + fVar111) * (fVar9 + fVar9 * auVar90._16_4_);
          local_11e0._20_4_ = (fVar112 + fVar112) * (fVar10 + fVar10 * auVar90._20_4_);
          local_11e0._24_4_ = (fVar114 + fVar114) * (fVar11 + fVar11 * auVar90._24_4_);
          local_11e0._28_4_ = local_1040._28_4_;
          auVar83 = ZEXT3264(local_11e0);
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar106._4_4_ = uVar77;
          auVar106._0_4_ = uVar77;
          auVar106._8_4_ = uVar77;
          auVar106._12_4_ = uVar77;
          auVar106._16_4_ = uVar77;
          auVar106._20_4_ = uVar77;
          auVar106._24_4_ = uVar77;
          auVar106._28_4_ = uVar77;
          auVar90 = vcmpps_avx(auVar106,local_11e0,2);
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar121._4_4_ = uVar77;
          auVar121._0_4_ = uVar77;
          auVar121._8_4_ = uVar77;
          auVar121._12_4_ = uVar77;
          auVar121._16_4_ = uVar77;
          auVar121._20_4_ = uVar77;
          auVar121._24_4_ = uVar77;
          auVar121._28_4_ = uVar77;
          auVar120 = vcmpps_avx(local_11e0,auVar121,2);
          auVar90 = vandps_avx(auVar120,auVar90);
          auVar87 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar79 = vpand_avx(auVar87,auVar79);
          auVar87 = vpmovsxwd_avx(auVar79);
          auVar100 = vpshufd_avx(auVar79,0xee);
          auVar100 = vpmovsxwd_avx(auVar100);
          auVar107._16_16_ = auVar100;
          auVar107._0_16_ = auVar87;
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar107 >> 0x7f,0) != '\0') ||
                (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar100 >> 0x3f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0xf] < '\0') {
            auVar90 = vcmpps_avx(auVar81,_DAT_02020f00,4);
            auVar87 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
            auVar79 = vpand_avx(auVar79,auVar87);
            auVar87 = vpmovsxwd_avx(auVar79);
            auVar100 = vpunpckhwd_avx(auVar79,auVar79);
            local_14e0._16_16_ = auVar100;
            local_14e0._0_16_ = auVar87;
            if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_14e0 >> 0x7f,0) != '\0') ||
                  (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar100 >> 0x3f,0) != '\0') ||
                (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar100[0xf] < '\0') {
              local_1300 = local_10a0;
              local_12e0 = local_10c0;
              local_12c0 = local_10e0;
              auVar90 = vrcpps_avx(local_10e0);
              fVar86 = auVar90._0_4_;
              fVar2 = auVar90._4_4_;
              auVar58._4_4_ = local_10e0._4_4_ * fVar2;
              auVar58._0_4_ = local_10e0._0_4_ * fVar86;
              fVar3 = auVar90._8_4_;
              auVar58._8_4_ = local_10e0._8_4_ * fVar3;
              fVar8 = auVar90._12_4_;
              auVar58._12_4_ = local_10e0._12_4_ * fVar8;
              fVar9 = auVar90._16_4_;
              auVar58._16_4_ = local_10e0._16_4_ * fVar9;
              fVar10 = auVar90._20_4_;
              auVar58._20_4_ = local_10e0._20_4_ * fVar10;
              fVar11 = auVar90._24_4_;
              auVar58._24_4_ = local_10e0._24_4_ * fVar11;
              auVar58._28_4_ = local_10e0._28_4_;
              auVar163._8_4_ = 0x3f800000;
              auVar163._0_8_ = &DAT_3f8000003f800000;
              auVar163._12_4_ = 0x3f800000;
              auVar163._16_4_ = 0x3f800000;
              auVar163._20_4_ = 0x3f800000;
              auVar163._24_4_ = 0x3f800000;
              auVar163._28_4_ = 0x3f800000;
              auVar120 = vsubps_avx(auVar163,auVar58);
              auVar131._0_4_ = fVar86 + fVar86 * auVar120._0_4_;
              auVar131._4_4_ = fVar2 + fVar2 * auVar120._4_4_;
              auVar131._8_4_ = fVar3 + fVar3 * auVar120._8_4_;
              auVar131._12_4_ = fVar8 + fVar8 * auVar120._12_4_;
              auVar131._16_4_ = fVar9 + fVar9 * auVar120._16_4_;
              auVar131._20_4_ = fVar10 + fVar10 * auVar120._20_4_;
              auVar131._24_4_ = fVar11 + fVar11 * auVar120._24_4_;
              auVar131._28_4_ = auVar90._28_4_ + auVar120._28_4_;
              auVar137._8_4_ = 0x219392ef;
              auVar137._0_8_ = 0x219392ef219392ef;
              auVar137._12_4_ = 0x219392ef;
              auVar137._16_4_ = 0x219392ef;
              auVar137._20_4_ = 0x219392ef;
              auVar137._24_4_ = 0x219392ef;
              auVar137._28_4_ = 0x219392ef;
              auVar120 = vcmpps_avx(local_1100,auVar137,5);
              auVar90 = vandps_avx(auVar120,auVar131);
              local_1240 = local_14e0;
              local_1160 = local_1120;
              auVar59._4_4_ = local_10a0._4_4_ * auVar90._4_4_;
              auVar59._0_4_ = local_10a0._0_4_ * auVar90._0_4_;
              auVar59._8_4_ = local_10a0._8_4_ * auVar90._8_4_;
              auVar59._12_4_ = local_10a0._12_4_ * auVar90._12_4_;
              auVar59._16_4_ = local_10a0._16_4_ * auVar90._16_4_;
              auVar59._20_4_ = local_10a0._20_4_ * auVar90._20_4_;
              auVar59._24_4_ = local_10a0._24_4_ * auVar90._24_4_;
              auVar59._28_4_ = auVar120._28_4_;
              auVar120 = vminps_avx(auVar59,auVar163);
              auVar60._4_4_ = local_10c0._4_4_ * auVar90._4_4_;
              auVar60._0_4_ = local_10c0._0_4_ * auVar90._0_4_;
              auVar60._8_4_ = local_10c0._8_4_ * auVar90._8_4_;
              auVar60._12_4_ = local_10c0._12_4_ * auVar90._12_4_;
              auVar60._16_4_ = local_10c0._16_4_ * auVar90._16_4_;
              auVar60._20_4_ = local_10c0._20_4_ * auVar90._20_4_;
              auVar60._24_4_ = local_10c0._24_4_ * auVar90._24_4_;
              auVar60._28_4_ = auVar90._28_4_;
              auVar90 = vminps_avx(auVar60,auVar163);
              auVar26 = vsubps_avx(auVar163,auVar120);
              local_1200 = vblendvps_avx(auVar90,auVar26,local_1120);
              auVar90 = vsubps_avx(auVar163,auVar90);
              local_1220 = vblendvps_avx(auVar120,auVar90,local_1120);
              fVar86 = local_1140._0_4_;
              fVar2 = local_1140._4_4_;
              fVar3 = local_1140._8_4_;
              fVar8 = local_1140._12_4_;
              fVar9 = local_1140._16_4_;
              fVar10 = local_1140._20_4_;
              fVar11 = local_1140._24_4_;
              uStack_11a4 = local_1220._28_4_;
              local_11c0[0] = fVar160 * fVar86;
              local_11c0[1] = fVar94 * fVar2;
              local_11c0[2] = fVar95 * fVar3;
              local_11c0[3] = fVar22 * fVar8;
              fStack_11b0 = fVar23 * fVar9;
              fStack_11ac = fVar24 * fVar10;
              fStack_11a8 = fVar25 * fVar11;
              local_11a0[0] = fVar159 * fVar86;
              local_11a0[1] = fVar165 * fVar2;
              local_11a0[2] = fVar166 * fVar3;
              local_11a0[3] = fVar167 * fVar8;
              fStack_1190 = fVar168 * fVar9;
              fStack_118c = fVar169 * fVar10;
              fStack_1188 = fVar170 * fVar11;
              uStack_1184 = uStack_11a4;
              auVar108._16_16_ = auVar100;
              auVar108._0_16_ = auVar87;
              auVar122._8_4_ = 0x7f800000;
              auVar122._0_8_ = 0x7f8000007f800000;
              auVar122._12_4_ = 0x7f800000;
              auVar122._16_4_ = 0x7f800000;
              auVar122._20_4_ = 0x7f800000;
              auVar122._24_4_ = 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar90 = vblendvps_avx(auVar122,local_11e0,auVar108);
              local_1180[0] = fVar86 * fVar143;
              local_1180[1] = fVar2 * fVar147;
              local_1180[2] = fVar3 * fVar149;
              local_1180[3] = fVar8 * fVar151;
              fStack_1170 = fVar9 * fVar153;
              fStack_116c = fVar10 * fVar155;
              fStack_1168 = fVar11 * fVar157;
              uStack_1164 = uStack_11a4;
              auVar120 = vshufps_avx(auVar90,auVar90,0xb1);
              auVar120 = vminps_avx(auVar90,auVar120);
              auVar26 = vshufpd_avx(auVar120,auVar120,5);
              auVar120 = vminps_avx(auVar120,auVar26);
              auVar26 = vperm2f128_avx(auVar120,auVar120,1);
              auVar120 = vminps_avx(auVar120,auVar26);
              auVar90 = vcmpps_avx(auVar90,auVar120,0);
              auVar87 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
              auVar79 = vpand_avx(auVar87,auVar79);
              auVar87 = vpmovsxwd_avx(auVar79);
              auVar79 = vpunpckhwd_avx(auVar79,auVar79);
              auVar92._16_16_ = auVar79;
              auVar92._0_16_ = auVar87;
              if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar92 >> 0x7f,0) == '\0') &&
                    (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar79 >> 0x3f,0) == '\0') &&
                  (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar79[0xf]) {
                auVar92 = local_14e0;
              }
              uVar65 = vmovmskps_avx(auVar92);
              uVar66 = 0;
              if (uVar65 != 0) {
                for (; (uVar65 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
                }
              }
              local_1540 = context->scene;
              pSVar68 = context->scene;
              fStack_1478 = fStack_147c;
              fStack_1474 = fStack_147c;
              fStack_1470 = fStack_147c;
              fStack_146c = fStack_147c;
              fStack_1468 = fStack_147c;
              fStack_1464 = fStack_147c;
              local_1060 = auVar80;
              local_1040 = auVar33;
LAB_00362f5b:
              uVar71 = (ulong)uVar66;
              uVar66 = *(uint *)((long)&local_fc0 + uVar71 * 4);
              pGVar6 = (pSVar68->geometries).items[uVar66].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_14e0 + uVar71 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar77 = *(undefined4 *)(local_1220 + uVar71 * 4);
                  uVar4 = *(undefined4 *)(local_1200 + uVar71 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_11c0[uVar71 - 8];
                  *(float *)(ray + k * 4 + 0xc0) = local_11c0[uVar71];
                  *(float *)(ray + k * 4 + 0xd0) = local_11a0[uVar71];
                  *(float *)(ray + k * 4 + 0xe0) = local_1180[uVar71];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar77;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_13c0 + uVar71 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar66;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_003633d8;
                }
                uVar77 = *(undefined4 *)(local_1220 + uVar71 * 4);
                local_1360._4_4_ = uVar77;
                local_1360._0_4_ = uVar77;
                local_1360._8_4_ = uVar77;
                local_1360._12_4_ = uVar77;
                uVar77 = *(undefined4 *)(local_1200 + uVar71 * 4);
                auVar88._4_4_ = uVar77;
                auVar88._0_4_ = uVar77;
                auVar88._8_4_ = uVar77;
                auVar88._12_4_ = uVar77;
                local_1330 = vpshufd_avx(ZEXT416(uVar66),0);
                uVar77 = *(undefined4 *)((long)&local_13c0 + uVar71 * 4);
                auVar119._4_4_ = uVar77;
                auVar119._0_4_ = uVar77;
                auVar119._8_4_ = uVar77;
                auVar119._12_4_ = uVar77;
                fVar86 = local_11c0[uVar71];
                fVar2 = local_11a0[uVar71];
                local_1380._4_4_ = fVar2;
                local_1380._0_4_ = fVar2;
                local_1380._8_4_ = fVar2;
                local_1380._12_4_ = fVar2;
                fVar2 = local_1180[uVar71];
                local_1370._4_4_ = fVar2;
                local_1370._0_4_ = fVar2;
                local_1370._8_4_ = fVar2;
                local_1370._12_4_ = fVar2;
                local_1390[0] = (RTCHitN)SUB41(fVar86,0);
                local_1390[1] = (RTCHitN)(char)((uint)fVar86 >> 8);
                local_1390[2] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
                local_1390[3] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
                local_1390[4] = (RTCHitN)SUB41(fVar86,0);
                local_1390[5] = (RTCHitN)(char)((uint)fVar86 >> 8);
                local_1390[6] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
                local_1390[7] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
                local_1390[8] = (RTCHitN)SUB41(fVar86,0);
                local_1390[9] = (RTCHitN)(char)((uint)fVar86 >> 8);
                local_1390[10] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
                local_1390[0xb] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
                local_1390[0xc] = (RTCHitN)SUB41(fVar86,0);
                local_1390[0xd] = (RTCHitN)(char)((uint)fVar86 >> 8);
                local_1390[0xe] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
                local_1390[0xf] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
                local_1350 = auVar88;
                local_1340 = auVar119;
                vcmpps_avx(ZEXT1632(local_1360),ZEXT1632(local_1360),0xf);
                uStack_131c = context->user->instID[0];
                local_1320 = uStack_131c;
                uStack_1318 = uStack_131c;
                uStack_1314 = uStack_131c;
                uStack_1310 = context->user->instPrimID[0];
                uStack_130c = uStack_1310;
                uStack_1308 = uStack_1310;
                uStack_1304 = uStack_1310;
                local_1480 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_11c0[uVar71 - 8];
                local_1590 = *local_1580;
                uStack_1588 = local_1580[1];
                local_1510.valid = (int *)&local_1590;
                local_1510.geometryUserPtr = pGVar6->userPtr;
                local_1510.context = context->user;
                local_1510.hit = local_1390;
                local_1510.N = 4;
                local_1560 = auVar83._0_32_;
                local_1510.ray = (RTCRayN *)ray;
                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_14a0._0_8_ = pauVar74;
                  (*pGVar6->intersectionFilterN)(&local_1510);
                  auVar83._8_56_ = extraout_var;
                  auVar83._0_8_ = extraout_XMM1_Qa;
                  auVar88 = auVar83._0_16_;
                  auVar83 = ZEXT3264(local_1560);
                  pauVar74 = (undefined1 (*) [16])local_14a0._0_8_;
                }
                auVar61._8_8_ = uStack_1588;
                auVar61._0_8_ = local_1590;
                if (auVar61 == (undefined1  [16])0x0) {
                  auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar87 = vpcmpeqd_avx(auVar88,auVar88);
                  auVar79 = auVar79 ^ auVar87;
                }
                else {
                  p_Var7 = context->args->filter;
                  auVar87 = vpcmpeqd_avx(auVar119,auVar119);
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&local_1510);
                    auVar83 = ZEXT3264(local_1560);
                    auVar87 = vpcmpeqd_avx(auVar87,auVar87);
                  }
                  auVar62._8_8_ = uStack_1588;
                  auVar62._0_8_ = local_1590;
                  auVar100 = vpcmpeqd_avx(auVar62,_DAT_01feba10);
                  auVar79 = auVar100 ^ auVar87;
                  if (auVar62 != (undefined1  [16])0x0) {
                    auVar100 = auVar100 ^ auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])local_1510.hit);
                    *(undefined1 (*) [16])(local_1510.ray + 0xc0) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0xd0) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0xe0) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0xf0) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0x100) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0x110) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0x120) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0x130) = auVar87;
                    auVar87 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_1510.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_1510.ray + 0x140) = auVar87;
                  }
                }
                auVar89._8_8_ = 0x100000001;
                auVar89._0_8_ = 0x100000001;
                if ((auVar89 & auVar79) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1480;
                }
                *(undefined4 *)(local_14e0 + uVar71 * 4) = 0;
                uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar82._4_4_ = uVar77;
                auVar82._0_4_ = uVar77;
                auVar82._8_4_ = uVar77;
                auVar82._12_4_ = uVar77;
                auVar82._16_4_ = uVar77;
                auVar82._20_4_ = uVar77;
                auVar82._24_4_ = uVar77;
                auVar82._28_4_ = uVar77;
                auVar90 = vcmpps_avx(auVar83._0_32_,auVar82,2);
                local_14e0 = vandps_avx(auVar90,local_14e0);
              }
              if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_14e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_14e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_14e0 >> 0x7f,0) == '\0') &&
                    (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_14e0 >> 0xbf,0) == '\0') &&
                  (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_14e0[0x1f]) goto LAB_003633d8;
              auVar93._8_4_ = 0x7f800000;
              auVar93._0_8_ = 0x7f8000007f800000;
              auVar93._12_4_ = 0x7f800000;
              auVar93._16_4_ = 0x7f800000;
              auVar93._20_4_ = 0x7f800000;
              auVar93._24_4_ = 0x7f800000;
              auVar93._28_4_ = 0x7f800000;
              auVar90 = vblendvps_avx(auVar93,auVar83._0_32_,local_14e0);
              auVar120 = vshufps_avx(auVar90,auVar90,0xb1);
              auVar120 = vminps_avx(auVar90,auVar120);
              auVar26 = vshufpd_avx(auVar120,auVar120,5);
              auVar120 = vminps_avx(auVar120,auVar26);
              auVar26 = vperm2f128_avx(auVar120,auVar120,1);
              auVar120 = vminps_avx(auVar120,auVar26);
              auVar120 = vcmpps_avx(auVar90,auVar120,0);
              auVar26 = local_14e0 & auVar120;
              auVar90 = local_14e0;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar90 = vandps_avx(auVar120,local_14e0);
              }
              uVar65 = vmovmskps_avx(auVar90);
              uVar66 = 0;
              pSVar68 = local_1540;
              if (uVar65 != 0) {
                for (; (uVar65 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
                }
              }
              goto LAB_00362f5b;
            }
          }
        }
LAB_003633d8:
        lVar72 = lVar72 + 1;
      } while (lVar72 != uVar75 - 8);
    }
    uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar83 = ZEXT1664(CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,uVar77))));
    auVar142 = ZEXT1664(local_13d0);
    auVar146 = ZEXT1664(local_13e0);
    auVar164 = ZEXT1664(local_13f0);
    auVar172 = ZEXT1664(local_1400);
    auVar175 = ZEXT1664(local_1410);
    auVar185 = ZEXT1664(local_1420);
    auVar200 = ZEXT1664(local_1430);
    auVar208 = ZEXT1664(local_1440);
    auVar210 = ZEXT1664(local_1450);
    auVar140 = ZEXT1664(local_14b0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }